

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::KeyMapBase<bool>::InsertOrReplaceNode
          (KeyMapBase<bool> *this,KeyNode *node)

{
  bool bVar1;
  NodeAndBucket NVar2;
  map_index_t local_34;
  map_index_t b;
  NodeAndBucket p;
  bool is_new;
  KeyNode *node_local;
  KeyMapBase<bool> *this_local;
  
  p._15_1_ = 1;
  bVar1 = KeyNode<bool>::key(node);
  NVar2 = FindHelper(this,bVar1);
  local_34 = NVar2.bucket;
  if (NVar2.node == (NodeBase *)0x0) {
    bVar1 = ResizeIfLoadIsOutOfRange(this,(ulong)((this->super_UntypedMapBase).num_elements_ + 1));
    if (bVar1) {
      bVar1 = KeyNode<bool>::key(node);
      local_34 = BucketNumber(this,bVar1);
    }
  }
  else {
    EraseImpl(this,local_34,(KeyNode *)NVar2.node,true);
    p._15_1_ = 0;
  }
  InsertUnique(this,local_34,node);
  (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ + 1;
  return (bool)p._15_1_;
}

Assistant:

bool InsertOrReplaceNode(KeyNode* node) {
    bool is_new = true;
    auto p = this->FindHelper(node->key());
    map_index_t b = p.bucket;
    if (ABSL_PREDICT_FALSE(p.node != nullptr)) {
      EraseImpl(p.bucket, static_cast<KeyNode*>(p.node), true);
      is_new = false;
    } else if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
      b = BucketNumber(node->key());  // bucket_number
    }
    InsertUnique(b, node);
    ++num_elements_;
    return is_new;
  }